

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_logicalxor(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x34d) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x34d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.logicalxor_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LogicalXorLayerParams>
                   (arena);
    (this->layer_).logicalxor_ = (LogicalXorLayerParams *)LVar2;
  }
  return (LogicalXorLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::_internal_mutable_logicalxor() {
  if (!_internal_has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = CreateMaybeMessage< ::CoreML::Specification::LogicalXorLayerParams >(GetArenaForAllocation());
  }
  return layer_.logicalxor_;
}